

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::removeedgebyflips(tetgenmesh *this,triface *flipedge,flipconstraints *fc)

{
  tetrahedron *pppdVar1;
  double *pdVar2;
  arraypool *this_00;
  tetrahedron *pppdVar3;
  long lVar4;
  uint nn;
  char *pcVar5;
  tetrahedron *pppdVar6;
  triface *abtets;
  undefined4 *puVar7;
  int iVar8;
  triface *ptVar9;
  uint uVar10;
  long lVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  
  if (((this->checksubsegflag == 0) || (flipedge->tet[8] == (tetrahedron)0x0)) ||
     (pdVar2 = flipedge->tet[8][ver2edge[flipedge->ver]], pdVar2 == (double *)0x0)) {
    pppdVar3 = flipedge->tet;
    iVar13 = flipedge->ver;
    lVar11 = 0;
    uVar10 = 0;
    pppdVar6 = pppdVar3;
    iVar8 = iVar13;
    do {
      pppdVar1 = pppdVar6 + facepivot1[iVar8];
      pppdVar6 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      iVar8 = facepivot2[iVar8][(uint)*pppdVar1 & 0xf];
      uVar10 = uVar10 - 1;
      lVar11 = lVar11 + -0x10;
    } while (pppdVar3 != pppdVar6);
    if (0xfffffffd < uVar10) {
      puVar7 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar7 = 2;
      __cxa_throw(puVar7,&int::typeinfo,0);
    }
    iVar8 = this->b->flipstarsize;
    nn = 0;
    if ((int)~uVar10 < iVar8 || iVar8 < 1) {
      abtets = (triface *)operator_new__(-lVar11);
      ptVar9 = abtets;
      do {
        ptVar9->tet = (tetrahedron *)0x0;
        ptVar9->ver = 0;
        ptVar9 = ptVar9 + 1;
      } while ((triface *)((long)abtets - lVar11) != ptVar9);
      piVar12 = &abtets->ver;
      pppdVar6 = pppdVar3;
      do {
        ((triface *)(piVar12 + -2))->tet = pppdVar6;
        *piVar12 = iVar13;
        *(undefined2 *)((long)pppdVar6 + (long)this->elemmarkerindex * 4 + 2) = 1;
        pppdVar1 = pppdVar6 + facepivot1[iVar13];
        pppdVar6 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
        iVar13 = facepivot2[iVar13][(uint)*pppdVar1 & 0xf];
        piVar12 = piVar12 + 4;
      } while (pppdVar3 != pppdVar6);
      nn = flipnm(this,abtets,-uVar10,0,0,fc);
      if (2 < (int)nn) {
        lVar11 = 0;
        do {
          lVar4 = *(long *)((long)&abtets->tet + lVar11);
          *(uint *)(lVar4 + (long)this->elemmarkerindex * 4) =
               (uint)*(ushort *)(lVar4 + (long)this->elemmarkerindex * 4);
          lVar11 = lVar11 + 0x10;
        } while ((ulong)nn << 4 != lVar11);
        flipedge->tet = abtets->tet;
        flipedge->ver = abtets->ver;
      }
      iVar13 = fc->unflip;
      fc->unflip = 0;
      flipnm_post(this,abtets,-uVar10,nn,0,fc);
      fc->unflip = iVar13;
      operator_delete__(abtets);
    }
  }
  else {
    nn = 0;
    if (fc->collectencsegflag != 0) {
      uVar14 = (ulong)pdVar2 & 0xfffffffffffffff8;
      uVar10 = *(uint *)(uVar14 + 4 + (long)this->shmarkindex * 4);
      if ((uVar10 & 1) == 0) {
        *(uint *)(uVar14 + 4 + (long)this->shmarkindex * 4) = uVar10 | 1;
        this_00 = this->caveencseglist;
        pcVar5 = arraypool::getblock(this_00,(int)this_00->objects);
        nn = 0;
        lVar11 = (long)this_00->objectbytes *
                 ((long)this_00->objectsperblock - 1U & this_00->objects);
        this_00->objects = this_00->objects + 1;
        *(ulong *)(pcVar5 + lVar11) = uVar14;
        *(uint *)(pcVar5 + lVar11 + 8) = (uint)pdVar2 & 7;
      }
    }
  }
  return nn;
}

Assistant:

int tetgenmesh::removeedgebyflips(triface *flipedge, flipconstraints* fc)
{
  triface *abtets, spintet;
  int t1ver; 
  int n, nn, i;


  if (checksubsegflag) {
    // Do not flip a segment.
    if (issubseg(*flipedge)) {
      if (fc->collectencsegflag) {
        face checkseg, *paryseg;
        tsspivot1(*flipedge, checkseg);
        if (!sinfected(checkseg)) {
          // Queue this segment in list.
          sinfect(checkseg);                
          caveencseglist->newindex((void **) &paryseg);
          *paryseg = checkseg;
        }
      }
      return 0;
    }
  }

  // Count the number of tets at edge [a,b].
  n = 0;
  spintet = *flipedge;
  while (1) {
    n++;
    fnextself(spintet);
    if (spintet.tet == flipedge->tet) break;
  }
  if (n < 3) {
    // It is only possible when the mesh contains inverted tetrahedra.  
    terminatetetgen(this, 2); // Report a bug
  }

  if ((b->flipstarsize > 0) && (n > b->flipstarsize)) {
    // The star size exceeds the limit.
    return 0; // Do not flip it.
  }

  // Allocate spaces.
  abtets = new triface[n];
  // Collect the tets at edge [a,b].
  spintet = *flipedge;
  i = 0;
  while (1) {
    abtets[i] = spintet;
    setelemcounter(abtets[i], 1); 
    i++;
    fnextself(spintet);
    if (spintet.tet == flipedge->tet) break;
  }


  // Try to flip the edge (level = 0, edgepivot = 0).
  nn = flipnm(abtets, n, 0, 0, fc);


  if (nn > 2) {
    // Edge is not flipped. Unmarktest the remaining tets in Star(ab).
    for (i = 0; i < nn; i++) {
      setelemcounter(abtets[i], 0);
    }
    // Restore the input edge (needed by Lawson's flip).
    *flipedge = abtets[0];
  }

  // Release the temporary allocated spaces.
  // NOTE: fc->unflip must be 0.
  int bakunflip = fc->unflip;
  fc->unflip = 0;
  flipnm_post(abtets, n, nn, 0, fc);
  fc->unflip = bakunflip;

  delete [] abtets;

  return nn; 
}